

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

bool __thiscall
CaPS_SA::Suffix_Array<unsigned_int>::is_sorted
          (Suffix_Array<unsigned_int> *this,idx_t *X,idx_t *L,idx_t n)

{
  uint *puVar1;
  uint in_ECX;
  int *in_RDX;
  long in_RSI;
  long *in_RDI;
  idx_t j;
  uint l;
  char *y;
  char *x;
  idx_t i;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  long local_38;
  long local_30;
  uint local_28;
  uint local_24;
  int *local_20;
  long local_18;
  bool local_1;
  
  if (*in_RDX == 0) {
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    for (local_28 = 1; local_28 < local_24; local_28 = local_28 + 1) {
      local_30 = *in_RDI + (ulong)*(uint *)(local_18 + (ulong)(local_28 - 1) * 4);
      local_38 = *in_RDI + (ulong)*(uint *)(local_18 + (ulong)local_28 * 4);
      local_40 = (int)in_RDI[1] - *(int *)(local_18 + (ulong)(local_28 - 1) * 4);
      local_44 = (int)in_RDI[1] - *(int *)(local_18 + (ulong)local_28 * 4);
      puVar1 = std::min<unsigned_int>(&local_40,&local_44);
      local_3c = *puVar1;
      for (local_48 = 0; local_48 < local_3c; local_48 = local_48 + 1) {
        if (*(char *)(local_30 + (ulong)local_48) < *(char *)(local_38 + (ulong)local_48)) {
          if (local_20[local_28] != local_48) {
            return false;
          }
          break;
        }
        if (*(char *)(local_38 + (ulong)local_48) < *(char *)(local_30 + (ulong)local_48)) {
          return false;
        }
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Suffix_Array<T_idx_>::is_sorted(const idx_t* const X, const idx_t* const L, const idx_t n) const
{
    if(L[0] != 0)
        return false;

    for(idx_t i = 1; i < n; ++i)
    {
        const auto x = T_ + X[i - 1], y = T_ + X[i];
        const auto l = std::min(n_ - X[i - 1], n_ - X[i]);

        for(idx_t j = 0; j < l; ++j)
            if(x[j] < y[j])
            {
                if(L[i] != j)
                    return false;

                break;
            }
            else if(x[j] > y[j])
                return false;
    }

    return true;
}